

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTree.cpp
# Opt level: O1

string * __thiscall
ASTree::dotName_abi_cxx11_(string *__return_storage_ptr__,ASTree *this,ASTree *ast)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  undefined8 *puVar4;
  long *plVar5;
  uint uVar6;
  size_type *psVar7;
  ulong uVar8;
  uint __len;
  undefined8 uVar9;
  uint __val;
  ulong uVar10;
  string __str;
  vector<ASTree_*,_std::allocator<ASTree_*>_> subtreesParent;
  long *local_a0;
  undefined8 local_98;
  long local_90;
  undefined8 uStack_88;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  string local_60;
  vector<ASTree_*,_std::allocator<ASTree_*>_> local_40;
  
  if (ast->parent == (ASTree *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"T","");
    return __return_storage_ptr__;
  }
  std::vector<ASTree_*,_std::allocator<ASTree_*>_>::vector(&local_40,&ast->parent->subtrees);
  if ((long)local_40.super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_40.super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    uVar8 = 0;
  }
  else {
    lVar2 = (long)local_40.super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_40.super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    uVar3 = lVar2 + (ulong)(lVar2 == 0);
    uVar10 = 0;
    do {
      uVar8 = uVar10;
      if (local_40.super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10] == ast) break;
      uVar10 = uVar10 + 1;
      uVar8 = uVar3;
    } while (uVar3 != uVar10);
  }
  dotName_abi_cxx11_(&local_60,this,ast->parent);
  __len = 1;
  __val = (uint)uVar8;
  if (9 < __val) {
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar6 = (uint)uVar8;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_0013c13b;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_0013c13b;
      }
      if (uVar6 < 10000) goto LAB_0013c13b;
      uVar8 = (uVar8 & 0xffffffff) / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar6);
    __len = __len + 1;
  }
LAB_0013c13b:
  local_80 = local_70;
  std::__cxx11::string::_M_construct((ulong)&local_80,(char)__len);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_80,__len,__val);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    uVar9 = local_60.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_78 + local_60._M_string_length) {
    uVar8 = 0xf;
    if (local_80 != local_70) {
      uVar8 = local_70[0];
    }
    if (local_78 + local_60._M_string_length <= uVar8) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_80,0,(char *)0x0,(ulong)local_60._M_dataplus._M_p);
      goto LAB_0013c1c3;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_80);
LAB_0013c1c3:
  local_a0 = &local_90;
  plVar5 = puVar4 + 2;
  if ((long *)*puVar4 == plVar5) {
    local_90 = *plVar5;
    uStack_88 = puVar4[3];
  }
  else {
    local_90 = *plVar5;
    local_a0 = (long *)*puVar4;
  }
  local_98 = puVar4[1];
  *puVar4 = plVar5;
  puVar4[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_a0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar7) {
    lVar2 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_40.super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ASTree::dotName(ASTree *ast) {
    // This generates an unique identifier
    if (!ast->getParent()) {
        return "T";
    } else {
        auto subtreesParent = ast->getParent()->getSubtrees();
        int j;
        for (j = 0; j < subtreesParent.size(); ++j) {
            if (subtreesParent[j] == ast) {
                break;
            }
        }
        return dotName(ast->parent) + std::to_string(j) + "N";
    }
}